

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O0

void __thiscall
spirv_cross::Compiler::CombinedImageSamplerHandler::push_remap_parameters
          (CombinedImageSamplerHandler *this,SPIRFunction *func,uint32_t *args,uint32_t length)

{
  uint32_t uVar1;
  Parameter *pPVar2;
  mapped_type *pmVar3;
  uint32_t local_78 [5];
  uint local_64;
  undefined1 local_60 [4];
  uint32_t i;
  unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  remapping;
  uint32_t length_local;
  uint32_t *args_local;
  SPIRFunction *func_local;
  CombinedImageSamplerHandler *this_local;
  
  remapping._M_h._M_single_bucket._4_4_ = length;
  ::std::
  unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  ::unordered_map((unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                   *)local_60);
  for (local_64 = 0; local_64 < remapping._M_h._M_single_bucket._4_4_; local_64 = local_64 + 1) {
    uVar1 = remap_parameter(this,args[local_64]);
    pPVar2 = VectorView<spirv_cross::SPIRFunction::Parameter>::operator[]
                       (&(func->arguments).super_VectorView<spirv_cross::SPIRFunction::Parameter>,
                        (ulong)local_64);
    local_78[0] = TypedID::operator_cast_to_unsigned_int((TypedID *)&pPVar2->id);
    pmVar3 = ::std::
             unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
             ::operator[]((unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                           *)local_60,local_78);
    *pmVar3 = uVar1;
  }
  ::std::
  stack<std::unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>,_std::deque<std::unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>,_std::allocator<std::unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>_>_>_>
  ::push(&this->parameter_remapping,(value_type *)local_60);
  ::std::
  unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  ::~unordered_map((unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                    *)local_60);
  return;
}

Assistant:

void Compiler::CombinedImageSamplerHandler::push_remap_parameters(const SPIRFunction &func, const uint32_t *args,
                                                                  uint32_t length)
{
	// If possible, pipe through a remapping table so that parameters know
	// which variables they actually bind to in this scope.
	unordered_map<uint32_t, uint32_t> remapping;
	for (uint32_t i = 0; i < length; i++)
		remapping[func.arguments[i].id] = remap_parameter(args[i]);
	parameter_remapping.push(move(remapping));
}